

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O1

bool __thiscall
UnifiedRegex::Matcher::RunContStack
          (Matcher *this,Char *input,CharCount *inputOffset,uint8 **instPointer,ContStack *contStack
          ,AssertionStack *assertionStack,uint *qcTicks)

{
  GroupInfo *pGVar1;
  LoopInfo *pLVar2;
  uint uVar3;
  CharCount CVar4;
  code *pcVar5;
  List<unsigned_int,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *pLVar6;
  undefined4 uVar7;
  bool bVar8;
  undefined4 *puVar9;
  size_t *psVar10;
  RepeatLoopCont *this_00;
  int i;
  int iVar11;
  
  puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  do {
    PopStats(this,contStack,input);
    psVar10 = (size_t *)
              ContinuousPageStack<1UL>::Pop
                        ((ContinuousPageStack<1UL> *)contStack,
                         (contStack->
                         super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
                         topElementSize);
    if (psVar10 == (size_t *)0x0) {
      this_00 = (RepeatLoopCont *)0x0;
    }
    else {
      (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
      topElementSize = *psVar10;
      this_00 = (RepeatLoopCont *)(psVar10 + 1);
    }
    if (this_00 == (RepeatLoopCont *)0x0) {
      iVar11 = 3;
      goto LAB_00effda3;
    }
    if (RewindLoopFixedGroupLastIteration < (this_00->super_Cont).tag) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar9 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                         ,0x13d3,"(cont->tag >= minContTag && cont->tag <= maxContTag)",
                         "cont->tag >= minContTag && cont->tag <= maxContTag");
      if (!bVar8) goto LAB_00effdc5;
      *puVar9 = 0;
    }
    switch((this_00->super_Cont).tag) {
    case Resume:
      *inputOffset = *(CharCount *)&(this_00->super_Cont).field_0xc;
      uVar3 = this_00->origInputOffset;
      if ((((this->program).ptr)->rep).insts.instsLen <= uVar3) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar9 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                           ,0x76d,"(label < program->rep.insts.instsLen)",
                           "label < program->rep.insts.instsLen");
        if (!bVar8) goto LAB_00effdc5;
        *puVar9 = 0;
      }
      *instPointer = (((this->program).ptr)->rep).insts.insts.ptr + uVar3;
      goto LAB_00effd9e;
    case RestoreLoop:
      QueryContinue(this,qcTicks);
      iVar11 = *(int *)&(this_00->super_Cont).field_0xc;
      if (((long)iVar11 < 0) || (((this->program).ptr)->numLoops <= iVar11)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar9 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                           ,0x77b,"(loopId >= 0 && loopId < program->numLoops)",
                           "loopId >= 0 && loopId < program->numLoops");
        if (!bVar8) goto LAB_00effdc5;
        *puVar9 = 0;
      }
      uVar7 = *(undefined4 *)&this_00->field_0x14;
      pLVar6 = (List<unsigned_int,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                *)this_00[1].super_Cont._vptr_Cont;
      pLVar2 = (this->loopInfos).ptr + iVar11;
      pLVar2->number = this_00->origInputOffset;
      pLVar2->startInputOffset = uVar7;
      pLVar2->offsetsOfFollowFirst = pLVar6;
      goto LAB_00effd5b;
    case RestoreGroup:
      iVar11 = *(int *)&(this_00->super_Cont).field_0xc;
      if (((long)iVar11 < 0) || ((int)(uint)((this->program).ptr)->numGroups <= iVar11)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar9 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                           ,0x782,"(groupId >= 0 && groupId < program->numGroups)",
                           "groupId >= 0 && groupId < program->numGroups");
        if (!bVar8) goto LAB_00effdc5;
        *puVar9 = 0;
      }
      uVar7 = *(undefined4 *)&this_00->field_0x14;
      pGVar1 = (this->groupInfos).ptr + iVar11;
      pGVar1->offset = this_00->origInputOffset;
      pGVar1->length = uVar7;
      goto LAB_00effd5b;
    case ResetGroup:
      iVar11 = *(int *)&(this_00->super_Cont).field_0xc;
      if (((long)iVar11 < 0) || ((int)(uint)((this->program).ptr)->numGroups <= iVar11)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar9 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                           ,0x782,"(groupId >= 0 && groupId < program->numGroups)",
                           "groupId >= 0 && groupId < program->numGroups");
        if (!bVar8) goto LAB_00effdc5;
        *puVar9 = 0;
      }
      (this->groupInfos).ptr[iVar11].length = 0xffffffff;
      goto LAB_00effd5b;
    case ResetGroupRange:
      CVar4 = this_00->origInputOffset;
      for (iVar11 = *(int *)&(this_00->super_Cont).field_0xc; iVar11 <= (int)CVar4;
          iVar11 = iVar11 + 1) {
        if ((iVar11 < 0) || ((int)(uint)((this->program).ptr)->numGroups <= iVar11)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar9 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                             ,0x782,"(groupId >= 0 && groupId < program->numGroups)",
                             "groupId >= 0 && groupId < program->numGroups");
          if (!bVar8) goto LAB_00effdc5;
          *puVar9 = 0;
        }
        (this->groupInfos).ptr[iVar11].length = 0xffffffff;
      }
      goto LAB_00effd5b;
    case RepeatLoop:
      bVar8 = RepeatLoopCont::Exec
                        (this_00,this,input,inputOffset,instPointer,contStack,assertionStack,qcTicks
                        );
      break;
    case PopAssertion:
      if ((assertionStack->
          super_ContinuousPageStackOfFixedElements<UnifiedRegex::AssertionInfo,_1UL>).
          super_ContinuousPageStack<1UL>.nextTop == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar9 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                           ,0x1221,"(!assertionStack.IsEmpty())","!assertionStack.IsEmpty()");
        if (!bVar8) goto LAB_00effdc5;
        *puVar9 = 0;
      }
      bVar8 = PopAssertion(this,inputOffset,instPointer,contStack,assertionStack,false);
      break;
    case RewindLoopFixed:
      bVar8 = RewindLoopFixedCont::Exec
                        ((RewindLoopFixedCont *)this_00,this,input,inputOffset,instPointer,contStack
                         ,assertionStack,qcTicks);
      break;
    case RewindLoopSet:
      bVar8 = RewindLoopSetCont::Exec
                        ((RewindLoopSetCont *)this_00,this,input,inputOffset,instPointer,contStack,
                         assertionStack,qcTicks);
      break;
    case RewindLoopSetWithFollowFirst:
      bVar8 = RewindLoopSetWithFollowFirstCont::Exec
                        ((RewindLoopSetWithFollowFirstCont *)this_00,this,input,inputOffset,
                         instPointer,contStack,assertionStack,qcTicks);
      break;
    case RewindLoopFixedGroupLastIteration:
      bVar8 = RewindLoopFixedGroupLastIterationCont::Exec
                        ((RewindLoopFixedGroupLastIterationCont *)this_00,this,input,inputOffset,
                         instPointer,contStack,assertionStack,qcTicks);
      break;
    default:
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar9 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                         ,0x13dc,"(false)","false");
      if (!bVar8) {
LAB_00effdc5:
        pcVar5 = (code *)invalidInstructionException();
        (*pcVar5)();
      }
      *puVar9 = 0;
LAB_00effd9e:
      iVar11 = 1;
      goto LAB_00effda3;
    }
    iVar11 = 1;
    if (bVar8 == false) {
LAB_00effd5b:
      iVar11 = 0;
    }
LAB_00effda3:
    if (iVar11 != 0) {
      return iVar11 != 1;
    }
  } while( true );
}

Assistant:

inline bool Matcher::RunContStack(const Char* const input, CharCount &inputOffset, const uint8 *&instPointer, ContStack &contStack, AssertionStack &assertionStack, uint &qcTicks)
    {
        while (true)
        {
#if ENABLE_REGEX_CONFIG_OPTIONS
            PopStats(contStack, input);
#endif
            Cont* cont = contStack.Pop();
            if (cont == 0)
            {
                break;
            }

            Assert(cont->tag >= minContTag && cont->tag <= maxContTag);
            // All these cases RESUME EXECUTION if backtracking finds a stop point
            const Cont::ContTag tag = cont->tag;
            switch (tag)
            {
#define M(O) case Cont::ContTag::O: if (((O##Cont*)cont)->Exec(*this, input, inputOffset, instPointer, contStack, assertionStack, qcTicks)) return false; break;
#include "RegexContcodes.h"
#undef M
            default:
                Assert(false); // should never be reached
                return false;  // however, can't use complier optimization if we wnat to return false here
            }
        }
        return true;
    }